

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpResponse.h
# Opt level: O2

HttpResponse<true> * __thiscall
uWS::HttpResponse<true>::writeStatus(HttpResponse<true> *this,string_view status)

{
  uint uVar1;
  AsyncSocketData<true> *pAVar2;
  
  pAVar2 = AsyncSocket<true>::getAsyncSocketData((AsyncSocket<true> *)this);
  uVar1 = *(uint *)((long)&pAVar2[5].buffer.field_2 + 4);
  if ((uVar1 & 1) == 0) {
    *(uint *)((long)&pAVar2[5].buffer.field_2 + 4) = uVar1 | 1;
    AsyncSocket<true>::write((AsyncSocket<true> *)this,0x17aecf,(void *)0x9,0);
    AsyncSocket<true>::write
              ((AsyncSocket<true> *)this,(int)status._M_str,(void *)(status._M_len & 0xffffffff),0);
    AsyncSocket<true>::write((AsyncSocket<true> *)this,0x17aebb,(void *)0x2,0);
  }
  return this;
}

Assistant:

HttpResponse *writeStatus(std::string_view status) {
        HttpResponseData<SSL> *httpResponseData = getHttpResponseData();

        /* Do not allow writing more than one status */
        if (httpResponseData->state & HttpResponseData<SSL>::HTTP_STATUS_CALLED) {
            return this;
        }

        /* Update status */
        httpResponseData->state |= HttpResponseData<SSL>::HTTP_STATUS_CALLED;

        Super::write("HTTP/1.1 ", 9);
        Super::write(status.data(), (int) status.length());
        Super::write("\r\n", 2);
        return this;
    }